

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O1

void __thiscall
HACD::WuColorQuantizer::Quantize
          (WuColorQuantizer *this,HaI32 PaletteSize,Vec3Vector *outputVertices)

{
  Vec3 *pVVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  HaI32 HVar5;
  HaI32 HVar6;
  uint uVar7;
  WuColorQuantizer *tag;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint capacity;
  WuColorQuantizer *this_00;
  Box *cube_00;
  uint uVar13;
  HaF32 HVar14;
  HaF32 HVar15;
  undefined1 auVar16 [64];
  float fVar17;
  HaF32 vv [1024];
  Box cube [1024];
  uint local_8038;
  HaF32 local_8034 [1023];
  Box local_7038 [1024];
  
  uVar13 = 0x400;
  if (PaletteSize < 0x400) {
    uVar13 = PaletteSize;
  }
  M3D(this,this->mWeight,this->mSumX,this->mSumY,this->mSumZ,this->mSumSquared);
  local_7038[0].g0 = 0;
  local_7038[0].r0 = 0;
  local_7038[0].r1 = 0x20;
  local_7038[0].b1 = 0x20;
  local_7038[0].g1 = 0x20;
  local_7038[0].b0 = 0;
  uVar9 = uVar13;
  if (1 < PaletteSize) {
    uVar11 = 1;
    iVar4 = 0;
    do {
      lVar10 = (long)iVar4;
      bVar3 = Cut(this,local_7038 + lVar10,local_7038 + (int)uVar11);
      if (bVar3) {
        HVar14 = 0.0;
        if (1 < local_7038[lVar10].vol) {
          HVar14 = Var(this,local_7038 + lVar10);
        }
        HVar15 = 0.0;
        local_8034[lVar10 + -1] = HVar14;
        if (1 < local_7038[(int)uVar11].vol) {
          HVar15 = Var(this,local_7038 + (int)uVar11);
        }
        local_8034[(long)(int)uVar11 + -1] = HVar15;
      }
      else {
        local_8034[lVar10 + -1] = 0.0;
        uVar11 = uVar11 - 1;
      }
      auVar16 = ZEXT464(local_8038);
      if ((int)uVar11 < 1) {
        iVar4 = 0;
      }
      else {
        iVar4 = 0;
        uVar8 = 1;
        do {
          fVar17 = auVar16._0_4_;
          auVar2 = vmaxss_avx(ZEXT416((uint)local_8034[uVar8 - 1]),auVar16._0_16_);
          auVar16 = ZEXT1664(auVar2);
          if (fVar17 < (float)local_8034[uVar8 - 1]) {
            iVar4 = (int)uVar8;
          }
          uVar8 = uVar8 + 1;
        } while (uVar11 + 1 != uVar8);
      }
      uVar11 = uVar11 + 1;
      uVar9 = uVar11;
    } while ((0.0 < auVar16._0_4_) && (uVar9 = uVar13, (int)uVar11 < (int)uVar13));
  }
  free(this->mSumSquared);
  this->mSumSquared = (HaF32 *)0x0;
  tag = (WuColorQuantizer *)malloc(0x8c61);
  this_00 = tag;
  memset(tag,0,0x8c61);
  if (0 < (int)uVar9) {
    cube_00 = local_7038;
    uVar8 = 0;
    do {
      Mark(this_00,cube_00,(HaI32)uVar8,(HaU8 *)tag);
      HVar5 = Vol(this_00,cube_00,this->mWeight);
      if (HVar5 != 0) {
        HVar6 = Vol(this_00,cube_00,this->mSumX);
        fVar17 = (float)HVar5;
        uVar13 = (uint)((float)HVar6 / fVar17 + 0.5);
        HVar5 = Vol(this_00,cube_00,this->mSumY);
        HVar6 = Vol(this_00,cube_00,this->mSumZ);
        if (0xff < uVar13) {
          __assert_fail("red >= 0 && red < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x250,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        uVar11 = (uint)((float)HVar5 / fVar17 + 0.5);
        if (0xff < uVar11) {
          __assert_fail("green >= 0 && green < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x251,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        uVar12 = (uint)((float)HVar6 / fVar17 + 0.5);
        if (0xff < uVar12) {
          __assert_fail("blue >= 0 && blue < 256",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                        ,0x252,"void HACD::WuColorQuantizer::Quantize(HaI32, Vec3Vector &)");
        }
        uVar7 = outputVertices->mCapacity & 0x7fffffff;
        if (uVar7 <= outputVertices->mSize) {
          capacity = outputVertices->mCapacity * 2;
          if (uVar7 == 0) {
            capacity = 1;
          }
          if (capacity <= uVar7) {
            __assert_fail("this->capacity() < capacity",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                          ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
          }
          hacd::vector<HACD::Vec3>::recreate(outputVertices,capacity);
        }
        uVar7 = outputVertices->mSize;
        pVVar1 = outputVertices->mData;
        pVVar1[uVar7].x = (HaF32)(((float)(int)uVar13 + -128.0) * 0.0078125);
        pVVar1[uVar7].y = (HaF32)(((float)(int)uVar11 + -128.0) * 0.0078125);
        pVVar1[uVar7].z = (HaF32)(((float)(int)uVar12 + -128.0) * 0.0078125);
        outputVertices->mSize = uVar7 + 1;
        this_00 = (WuColorQuantizer *)outputVertices;
      }
      uVar8 = uVar8 + 1;
      cube_00 = cube_00 + 1;
    } while (uVar9 != uVar8);
  }
  return;
}

Assistant:

void WuColorQuantizer::Quantize(HaI32 PaletteSize,Vec3Vector &outputVertices) 
{
	HaU8 *tag = NULL;

	if ( PaletteSize > MAXCOLOR )
	{
		PaletteSize = MAXCOLOR;
	}
	Box	cube[MAXCOLOR];
	HaI32	next;
	HaI32 i, weight;
	HaI32 k;
	HaF32 vv[MAXCOLOR], temp;

	// Compute moments
	M3D(mWeight, mSumX, mSumY, mSumZ, mSumSquared);

	cube[0].r0 = cube[0].g0 = cube[0].b0 = 0;
	cube[0].r1 = cube[0].g1 = cube[0].b1 = 32;
	next = 0;

	for (i = 1; i < PaletteSize; i++) 
	{
		if(Cut(&cube[next], &cube[i])) 
		{
			// volume test ensures we won't try to cut one-cell box
			vv[next] = (cube[next].vol > 1) ? Var(&cube[next]) : 0;
			vv[i] = (cube[i].vol > 1) ? Var(&cube[i]) : 0;
		} 
		else 
		{
			vv[next] = 0.0;   // don't try to split this box again
			i--;              // didn't create box i
		}

		next = 0; temp = vv[0];

		for (k = 1; k <= i; k++) 
		{
			if (vv[k] > temp) 
			{
				temp = vv[k]; next = k;
			}
		}

		if (temp <= 0.0) 
		{
			PaletteSize = i + 1;
			// Error: "Only got 'PaletteSize' boxes"
			break;
		}
	}

	// Partition done
	// the space for array mSumSquared can be freed now
	free(mSumSquared);
	mSumSquared = NULL;

	// create an optimized palette
	tag = (HaU8*) malloc(SIZE_3D * sizeof(HaU8));
	memset(tag, 0, SIZE_3D * sizeof(HaU8));

	for (k = 0; k < PaletteSize ; k++) 
	{
		Mark(&cube[k], k, tag);
		weight = Vol(&cube[k], mWeight);

		if (weight) 
		{
			HaI32 red	= (HaI32)(((HaF32)Vol(&cube[k], mSumX) / (HaF32)weight) + 0.5f);
			HaI32 green = (HaI32)(((HaF32)Vol(&cube[k], mSumY) / (HaF32)weight) + 0.5f);
			HaI32 blue	= (HaI32)(((HaF32)Vol(&cube[k], mSumZ) / (HaF32)weight) + 0.5f);
			HACD_ASSERT( red >= 0 && red < 256 );
			HACD_ASSERT( green >= 0 && green < 256 );
			HACD_ASSERT( blue >= 0 && blue < 256 );
			Vec3 v;
			v.x = (red-128.0f)/128.0f;
			v.y = (green-128.0f)/128.0f;
			v.z = (blue-128.0f)/128.0f;
			outputVertices.push_back(v);
		} 
		else 
		{
		}
	}
}